

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::dasmAddqEa<(moira::Instr)121,(moira::Mode)6,(moira::Size)4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  char **s;
  int iVar1;
  char *pcVar2;
  uint uVar3;
  char cVar4;
  char *pcVar5;
  long lVar6;
  Ea<(moira::Mode)6,_(moira::Size)4> dst;
  Ea<(moira::Mode)6,_(moira::Size)4> local_2c;
  
  Op<(moira::Mode)6,(moira::Size)4>(&local_2c,this,op & 7,addr);
  uVar3 = 8;
  if ((op & 0xe00) != 0) {
    uVar3 = op >> 9 & 7;
  }
  pcVar5 = "subq";
  if (str->upper != false) {
    pcVar5 = "SUBQ";
  }
  cVar4 = *pcVar5;
  while (cVar4 != '\0') {
    pcVar5 = pcVar5 + 1;
    pcVar2 = str->ptr;
    str->ptr = pcVar2 + 1;
    *pcVar2 = cVar4;
    cVar4 = *pcVar5;
  }
  if (str->upper == false) {
    cVar4 = '.';
    lVar6 = 0;
    do {
      pcVar5 = str->ptr;
      str->ptr = pcVar5 + 1;
      *pcVar5 = cVar4;
      cVar4 = ".l"[lVar6 + 1];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 2);
  }
  else {
    cVar4 = '.';
    lVar6 = 0;
    do {
      pcVar5 = str->ptr;
      str->ptr = pcVar5 + 1;
      *pcVar5 = cVar4;
      cVar4 = ".L"[lVar6 + 1];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 2);
  }
  iVar1 = (this->tab).raw;
  s = &str->ptr;
  while (pcVar5 = str->ptr, pcVar5 < str->base + iVar1) {
    str->ptr = pcVar5 + 1;
    *pcVar5 = ' ';
  }
  pcVar5 = *s;
  *s = pcVar5 + 1;
  *pcVar5 = '#';
  sprintd(s,(ulong)uVar3);
  cVar4 = ',';
  lVar6 = 0;
  do {
    pcVar5 = *s;
    *s = pcVar5 + 1;
    *pcVar5 = cVar4;
    cVar4 = "), "[lVar6 + 2];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 2);
  StrWriter::operator<<(str,&local_2c);
  return;
}

Assistant:

void
Moira::dasmAddqEa(StrWriter &str, u32 &addr, u16 op)
{
    auto src = Imd      ( ____xxx_________(op)       );
    auto dst = Op <M,S> ( _____________xxx(op), addr );

    if (src.raw == 0) src.raw = 8;
    str << Ins<I>{} << Sz<S>{} << tab << src << ", " << dst;
}